

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O0

void drawMap(WINDOW *body,Map *map)

{
  int iVar1;
  int local_1c;
  int y;
  Map *map_local;
  WINDOW *body_local;
  
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    iVar1 = wmove(body,local_1c,1);
    if (iVar1 != -1) {
      waddnstr(body,map->overlay + local_1c,0xffffffff);
    }
  }
  for (local_1c = 0; local_1c < 0x18; local_1c = local_1c + 1) {
    iVar1 = wmove(body,local_1c,0);
    if (iVar1 != -1) {
      waddch(body,_DAT_0010b280);
    }
    iVar1 = wmove(body,local_1c,0x4f);
    if (iVar1 != -1) {
      waddch(body,_DAT_0010b280);
    }
  }
  return;
}

Assistant:

void drawMap(WINDOW *body, struct Map *map) {
    int y;
    for (y = 0; y < MAP_ROWS; y++)
        mvwaddstr(body, y, 1, map->overlay[y]);
    for (y = 0; y < MAX_ROWS; y++) {
        mvwaddch(body, y, 0, ACS_VLINE);
        mvwaddch(body, y, MAX_COLS - 1, ACS_VLINE);
    }
}